

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *this,Arg *arg)

{
  StringValue<char> SVar1;
  StringValue<wchar_t> SVar2;
  CustomValue CVar3;
  unkbyte10 *in_RSI;
  undefined2 in_DI;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa2;
  uint local_4;
  
  switch((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
         (ulong)*(uint *)(in_RSI + 1)) {
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x0:
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x1:
  default:
    local_4 = 0;
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x2:
    local_4 = visit_int((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                        CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c);
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x3:
    local_4 = visit_uint((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                         CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x4:
    local_4 = visit_long_long((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                              CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x5:
    local_4 = visit_ulong_long((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *
                               )CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x6:
    local_4 = visit_bool((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                         CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                         SUB41(in_stack_ffffffffffffff9c >> 0x18,0));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x7:
    local_4 = visit_char((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                         CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x8:
    local_4 = visit_double((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                           CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                           (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0x9:
    local_4 = visit_long_double((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int>
                                 *)(ulong)*(uint *)(in_RSI + 1),
                                (longdouble)
                                CONCAT28(in_DI,CONCAT62(in_stack_ffffffffffffffa2,
                                                        (short)((unkuint10)*in_RSI >> 0x40))));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0xa:
    local_4 = visit_cstring((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                            CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                            (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0xb:
    SVar1.value._4_4_ = in_stack_ffffffffffffff9c;
    SVar1.value._0_4_ = in_stack_ffffffffffffff98;
    SVar1.size._0_2_ = in_stack_ffffffffffffffa0;
    SVar1.size._2_6_ = in_stack_ffffffffffffffa2;
    local_4 = visit_string((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                           0x108a21,SVar1);
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0xc:
    SVar2.value._4_4_ = in_stack_ffffffffffffff9c;
    SVar2.value._0_4_ = in_stack_ffffffffffffff98;
    SVar2.size._0_2_ = in_stack_ffffffffffffffa0;
    SVar2.size._2_6_ = in_stack_ffffffffffffffa2;
    local_4 = visit_wstring((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                            0x108a54,SVar2);
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0xd:
    local_4 = visit_pointer((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                            CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                            (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)0xe:
    CVar3.value._4_4_ = in_stack_ffffffffffffff9c;
    CVar3.value._0_4_ = in_stack_ffffffffffffff98;
    CVar3.format._0_2_ = in_stack_ffffffffffffffa0;
    CVar3.format._2_6_ = in_stack_ffffffffffffffa2;
    local_4 = visit_custom((ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *)
                           0x108a9c,CVar3);
  }
  return local_4;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }